

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_integer_add(sysbvm_context_t *context,sysbvm_tuple_t left,sysbvm_tuple_t right)

{
  undefined8 resultWordCount_00;
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  sysbvm_stuple_t sVar4;
  sysbvm_stuple_t sVar5;
  sysbvm_object_tuple_t *psVar6;
  sysbvm_tuple_t local_100;
  sysbvm_tuple_t local_f0;
  sysbvm_tuple_t local_e0;
  sysbvm_integer_t *local_d0;
  sysbvm_integer_t *result_2;
  _Bool resultIsNegative_1;
  size_t resultWordCount_2;
  sysbvm_integer_t *result_1;
  _Bool resultIsNegative;
  size_t resultWordCount_1;
  int magnitudeComparison;
  sysbvm_integer_t *result;
  size_t resultWordCount;
  undefined1 local_78 [4];
  uint32_t carry;
  sysbvm_decoded_integer_t decodedRightInteger;
  sysbvm_decoded_integer_t decodedLeftInteger;
  sysbvm_stuple_t rightValue;
  sysbvm_stuple_t leftValue;
  sysbvm_tuple_t right_local;
  sysbvm_tuple_t left_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isImmediate(left);
  if ((_Var1) && (_Var1 = sysbvm_tuple_isImmediate(right), _Var1)) {
    sVar4 = sysbvm_tuple_integer_decodeSmall(left);
    sVar5 = sysbvm_tuple_integer_decodeSmall(right);
    context_local = (sysbvm_context_t *)sysbvm_tuple_integer_encodeInt64(context,sVar4 + sVar5);
  }
  else {
    memset(decodedRightInteger.inlineWordBuffer,0,0x20);
    memset(local_78,0,0x20);
    sysbvm_integer_decodeLargeOrImmediate
              (context,(sysbvm_decoded_integer_t *)decodedRightInteger.inlineWordBuffer,left);
    sysbvm_integer_decodeLargeOrImmediate(context,(sysbvm_decoded_integer_t *)local_78,right);
    if (((byte)decodedRightInteger.inlineWordBuffer[0] & 1) == (local_78[0] & 1U)) {
      uVar2 = sysbvm_integer_sumInto
                        (decodedLeftInteger._0_8_,(uint32_t *)decodedLeftInteger.wordCount,
                         decodedRightInteger._0_8_,(uint32_t *)decodedRightInteger.wordCount,0,
                         (uint32_t *)0x0);
      if ((ulong)decodedRightInteger._0_8_ < (ulong)decodedLeftInteger._0_8_) {
        local_d0 = (sysbvm_integer_t *)decodedLeftInteger._0_8_;
      }
      else {
        local_d0 = (sysbvm_integer_t *)decodedRightInteger._0_8_;
      }
      result = local_d0;
      if (uVar2 != 0) {
        result = (sysbvm_integer_t *)((long)&(local_d0->header).field_0 + 1);
      }
      if (((byte)decodedRightInteger.inlineWordBuffer[0] & 1) == 0) {
        local_e0 = (context->roots).largePositiveIntegerType;
      }
      else {
        local_e0 = (context->roots).largeNegativeIntegerType;
      }
      context_local =
           (sysbvm_context_t *)sysbvm_context_allocateByteTuple(context,local_e0,(long)result << 2);
      sysbvm_integer_sumInto
                (decodedLeftInteger._0_8_,(uint32_t *)decodedLeftInteger.wordCount,
                 decodedRightInteger._0_8_,(uint32_t *)decodedRightInteger.wordCount,(size_t)result,
                 (uint32_t *)
                 ((anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)
                 &(context_local->heap).shouldAttemptToCollect)->pointers);
    }
    else {
      iVar3 = sysbvm_integer_compareMagnitudes
                        (decodedLeftInteger._0_8_,(uint32_t *)decodedLeftInteger.wordCount,
                         decodedRightInteger._0_8_,(uint32_t *)decodedRightInteger.wordCount);
      resultWordCount_00 = decodedRightInteger._0_8_;
      if (iVar3 == 0) {
        context_local = (sysbvm_context_t *)sysbvm_tuple_integer_encodeSmall(0);
      }
      else if (iVar3 < 1) {
        if ((local_78[0] & 1U) == 0) {
          local_100 = (context->roots).largePositiveIntegerType;
        }
        else {
          local_100 = (context->roots).largeNegativeIntegerType;
        }
        psVar6 = sysbvm_context_allocateByteTuple(context,local_100,decodedRightInteger._0_8_ << 2);
        sysbvm_integer_subtractFromInto
                  (decodedRightInteger._0_8_,(uint32_t *)decodedRightInteger.wordCount,
                   decodedLeftInteger._0_8_,(uint32_t *)decodedLeftInteger.wordCount,
                   resultWordCount_00,(uint32_t *)(psVar6->field_1).pointers);
        context_local =
             (sysbvm_context_t *)sysbvm_integer_normalize(context,(sysbvm_integer_t *)psVar6);
      }
      else {
        if (((byte)decodedRightInteger.inlineWordBuffer[0] & 1) == 0) {
          local_f0 = (context->roots).largePositiveIntegerType;
        }
        else {
          local_f0 = (context->roots).largeNegativeIntegerType;
        }
        psVar6 = sysbvm_context_allocateByteTuple(context,local_f0,decodedLeftInteger._0_8_ << 2);
        sysbvm_integer_subtractFromInto
                  (decodedLeftInteger._0_8_,(uint32_t *)decodedLeftInteger.wordCount,
                   decodedRightInteger._0_8_,(uint32_t *)decodedRightInteger.wordCount,
                   decodedLeftInteger._0_8_,(uint32_t *)(psVar6->field_1).pointers);
        context_local =
             (sysbvm_context_t *)sysbvm_integer_normalize(context,(sysbvm_integer_t *)psVar6);
      }
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_add(sysbvm_context_t *context, sysbvm_tuple_t left, sysbvm_tuple_t right)
{
    if(sysbvm_tuple_isImmediate(left) && sysbvm_tuple_isImmediate(right))
    {
        sysbvm_stuple_t leftValue = sysbvm_tuple_integer_decodeSmall(left);
        sysbvm_stuple_t rightValue = sysbvm_tuple_integer_decodeSmall(right);
        return sysbvm_tuple_integer_encodeInt64(context, leftValue + rightValue);
    }

    sysbvm_decoded_integer_t decodedLeftInteger = {0};
    sysbvm_decoded_integer_t decodedRightInteger = {0};
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedLeftInteger, left);
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedRightInteger, right);

    if(decodedLeftInteger.isNegative == decodedRightInteger.isNegative)
    {
        // Same sign, sum
        uint32_t carry = sysbvm_integer_sumInto(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words, 0, NULL);
        size_t resultWordCount = (decodedLeftInteger.wordCount > decodedRightInteger.wordCount) ? decodedLeftInteger.wordCount : decodedRightInteger.wordCount;
        if(carry != 0)
            ++resultWordCount;

        sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, decodedLeftInteger.isNegative ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType, resultWordCount*4);
        sysbvm_integer_sumInto(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words, resultWordCount, result->words);
        return (sysbvm_tuple_t)result;
    }
    else
    {
        // Different sign, subtract.
        int magnitudeComparison = sysbvm_integer_compareMagnitudes(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words);
        if(magnitudeComparison == 0)
            return sysbvm_tuple_integer_encodeSmall(0);

        if(magnitudeComparison > 0)
        {
            size_t resultWordCount = decodedLeftInteger.wordCount;
            bool resultIsNegative = decodedLeftInteger.isNegative;
            sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, resultIsNegative ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType, resultWordCount*4);
            sysbvm_integer_subtractFromInto(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words, resultWordCount, result->words);
            return sysbvm_integer_normalize(context, result);
        }
        else
        {
            size_t resultWordCount = decodedRightInteger.wordCount;
            bool resultIsNegative = decodedRightInteger.isNegative;
            sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, resultIsNegative ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType, resultWordCount*4);
            sysbvm_integer_subtractFromInto(decodedRightInteger.wordCount, decodedRightInteger.words, decodedLeftInteger.wordCount, decodedLeftInteger.words, resultWordCount, result->words);
            return sysbvm_integer_normalize(context, result);
        }
    }
}